

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool Dominates(VmInstruction *a,VmInstruction *b)

{
  bool bVar1;
  
  if (a->parent != b->parent) {
    bVar1 = Dominates(a->parent,b->parent);
    return bVar1;
  }
  bVar1 = IsAfter(b,a);
  return bVar1;
}

Assistant:

bool Dominates(VmInstruction *a, VmInstruction *b)
{
	// If instructions come from different blocks, check if blocks dominate each other
	if(a->parent != b->parent)
		return Dominates(a->parent, b->parent);

	// a dominates b is b is defined after a in the same block
	if(IsAfter(b, a))
		return true;

	return false;
}